

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_RelLong(Expression *expr,uint32_t pcShift)

{
  bool bVar1;
  uint32_t b;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    bVar1 = reserveSpace(2);
    if (bVar1) {
      if (expr->isKnown == false) {
        out_CreatePatch(2,expr,loadOffset + curOffset,pcShift);
        b = 0;
      }
      else {
        b = expr->val;
      }
      writelong(b);
      rpn_Free(expr);
      return;
    }
  }
  return;
}

Assistant:

void sect_RelLong(struct Expression *expr, uint32_t pcShift)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(2))
		return;

	if (!rpn_isKnown(expr)) {
		createPatch(PATCHTYPE_LONG, expr, pcShift);
		writelong(0);
	} else {
		writelong(expr->val);
	}
	rpn_Free(expr);
}